

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_DPQueryHandler(CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  long *in_RDX;
  undefined8 in_RSI;
  _DPQueryResponseMsg response;
  _DPQueryMsg *Msg;
  int res;
  SstStream Stream;
  char *tmpstr;
  undefined4 local_58 [2];
  char *local_50;
  long *local_48;
  int local_3c;
  SstStream local_38;
  void *local_30;
  long *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ps_register_thread_();
  if (_perfstubs_initialized == 1) {
    if (CP_DPQueryHandler::timer == (void *)0x0) {
      local_30 = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                             ,"CP_DPQueryHandler",0x98b);
      CP_DPQueryHandler::timer = (void *)ps_timer_create_(local_30);
      free(local_30);
    }
    ps_timer_start_(CP_DPQueryHandler::timer);
  }
  local_48 = local_18;
  local_38 = (SstStream)*local_18;
  memset(local_58,0,0x10);
  local_58[0] = (undefined4)local_48[1];
  local_50 = local_38->DP_Interface->DPName;
  local_3c = CMwrite(local_10,local_38->CPInfo->SharedCM->DPQueryResponseFormat,local_58);
  if (local_3c != 1) {
    CP_verbose(local_38,PerStepVerbose,
               "Message failed to send to unregistered reader on writer %p\n",local_38);
  }
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_DPQueryHandler::timer);
  }
  return;
}

Assistant:

void CP_DPQueryHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                       attr_list attrs)
{
    PERFSTUBS_REGISTER_THREAD();
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    int res;
    struct _DPQueryMsg *Msg = (struct _DPQueryMsg *)Msg_v;
    struct _DPQueryResponseMsg response;
    Stream = Msg->WriterFile;
    memset(&response, 0, sizeof(response));
    response.WriterResponseCondition = Msg->WriterResponseCondition;
    response.OperativeDP = Stream->DP_Interface->DPName;
    res = CMwrite(conn, Stream->CPInfo->SharedCM->DPQueryResponseFormat, &response);
    if (res != 1)
    {
        CP_verbose(Stream, PerStepVerbose,
                   "Message failed to send to unregistered reader on writer %p\n", Stream);
    }

    PERFSTUBS_TIMER_STOP_FUNC(timer);
}